

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O1

POST * __thiscall minihttp::POST::add(POST *this,char *key,char *value)

{
  allocator<char> local_39;
  string local_38;
  
  if ((this->data)._M_string_length != 0) {
    std::__cxx11::string::push_back((char)this);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,key,&local_39);
  URLEncode(&local_38,&this->data);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::push_back((char)this);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,value,&local_39);
  URLEncode(&local_38,&this->data);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return this;
}

Assistant:

POST& POST::add(const char *key, const char *value)
{
    if(!empty())
        data += '&';
    URLEncode(key, data);
    data += '=';
    URLEncode(value, data);
    return *this;
}